

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_bytedata.cpp
# Opt level: O1

void __thiscall ByteData_Concat_Test::~ByteData_Concat_Test(ByteData_Concat_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ByteData, Concat) {
  ByteData base("0011");
  ByteData data1("2233");
  ByteData160 data2("4444444444444444444444444444444444444444");
  ByteData256 data3("5555555555555555555555555555555555555555555555555555555555555555");
  ByteData result;

  EXPECT_NO_THROW(result = base.Concat(data1, data2, data3));
  EXPECT_STREQ(result.GetHex().c_str(), "0011223344444444444444444444444444444444444444445555555555555555555555555555555555555555555555555555555555555555");
}